

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O2

void __thiscall CMenus::RenderMenubar(CMenus *this,CUIRect Rect)

{
  long lVar1;
  IServerBrowser *pIVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  CGameClient *pCVar7;
  int Corners;
  int NewPage;
  long in_FS_OFFSET;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  CUIRect Button_1;
  CUIRect Right;
  CUIRect Left;
  CUIRect Button;
  CUIRect Box;
  CUIRect Rect_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Rect_local = Rect;
  CUIRect::HSplitTop(&Rect_local,60.0,&Box,&Rect_local);
  iVar5 = this->m_MenuPage;
  this->m_ActivePage = iVar5;
  iVar4 = ((this->super_CComponent).m_pClient)->m_pClient->m_State;
  Corners = 0xf;
  if (iVar4 == 0) {
    NewPage = -1;
    iVar4 = 0;
LAB_00143f88:
    bVar3 = iVar4 == 0;
    if (!bVar3 || iVar5 != 8) goto LAB_00143f9d;
    bVar8 = false;
  }
  else {
    this->m_ActivePage = this->m_GamePage;
    if (iVar4 == 3) {
      fVar9 = Box.w / 6.0 + -2.5;
      fVar10 = *(float *)(&DAT_001ca298 + (ulong)(this->m_GamePage == 8) * 4);
      CUIRect::VSplitLeft(&Box,fVar9 * 4.0 + 9.0,&Left,(CUIRect *)0x0);
      CUIRect::VSplitRight(&Box,fVar9 * 1.5 + 3.0,(CUIRect *)0x0,&Right);
      RenderBackgroundShadow(this,&Left,false,5.0);
      RenderBackgroundShadow(this,&Right,false,5.0);
      CUIRect::HSplitBottom(&Left,25.0,(CUIRect *)0x0,&Left);
      CUIRect::HSplitBottom(&Right,25.0,(CUIRect *)0x0,&Right);
      CUIRect::VSplitLeft(&Left,fVar9,&Button,&Left);
      if ((RenderMenubar(CUIRect)::s_GameButton == '\0') &&
         (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_GameButton), iVar5 != 0)) {
        RenderMenubar::s_GameButton.m_FadeStartTime = 0.0;
        RenderMenubar::s_GameButton.m_CleanBackground = false;
        __cxa_guard_release(&RenderMenubar(CUIRect)::s_GameButton);
      }
      pcVar6 = Localize("Game","");
      bVar3 = DoButton_MenuTabTop(this,&RenderMenubar::s_GameButton,pcVar6,this->m_ActivePage == 1,
                                  &Button,fVar10,fVar10,0xf,5.0,0.0);
      if ((bVar3) || (bVar3 = CheckHotKey(this,0x67), bVar3)) {
        NewPage = 1;
      }
      else {
        NewPage = -1;
      }
      CUIRect::VSplitLeft(&Left,3.0,(CUIRect *)0x0,&Left);
      CUIRect::VSplitLeft(&Left,fVar9,&Button,&Left);
      if ((RenderMenubar(CUIRect)::s_PlayersButton == '\0') &&
         (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_PlayersButton), iVar5 != 0)) {
        RenderMenubar::s_PlayersButton.m_FadeStartTime = 0.0;
        RenderMenubar::s_PlayersButton.m_CleanBackground = false;
        __cxa_guard_release(&RenderMenubar(CUIRect)::s_PlayersButton);
      }
      pcVar6 = Localize("Players","");
      bVar3 = DoButton_MenuTabTop(this,&RenderMenubar::s_PlayersButton,pcVar6,
                                  this->m_ActivePage == 2,&Button,fVar10,fVar10,0xf,5.0,0.0);
      if ((bVar3) || (bVar3 = CheckHotKey(this,0x70), bVar3)) {
        NewPage = 2;
      }
      CUIRect::VSplitLeft(&Left,3.0,(CUIRect *)0x0,&Left);
      CUIRect::VSplitLeft(&Left,fVar9,&Button,&Left);
      if ((RenderMenubar(CUIRect)::s_ServerInfoButton == '\0') &&
         (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_ServerInfoButton), iVar5 != 0)) {
        RenderMenubar::s_ServerInfoButton.m_FadeStartTime = 0.0;
        RenderMenubar::s_ServerInfoButton.m_CleanBackground = false;
        __cxa_guard_release(&RenderMenubar(CUIRect)::s_ServerInfoButton);
      }
      pcVar6 = Localize("Server info","");
      bVar3 = DoButton_MenuTabTop(this,&RenderMenubar::s_ServerInfoButton,pcVar6,
                                  this->m_ActivePage == 3,&Button,fVar10,fVar10,0xf,5.0,0.0);
      if ((bVar3) || (bVar3 = CheckHotKey(this,0x69), bVar3)) {
        NewPage = 3;
      }
      CUIRect::VSplitLeft(&Left,3.0,(CUIRect *)0x0,&Left);
      CUIRect::VSplitLeft(&Left,fVar9,&Button,&Left);
      if ((RenderMenubar(CUIRect)::s_CallVoteButton == '\0') &&
         (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_CallVoteButton), iVar5 != 0)) {
        RenderMenubar::s_CallVoteButton.m_FadeStartTime = 0.0;
        RenderMenubar::s_CallVoteButton.m_CleanBackground = false;
        __cxa_guard_release(&RenderMenubar(CUIRect)::s_CallVoteButton);
      }
      pcVar6 = Localize("Call vote","");
      bVar3 = DoButton_MenuTabTop(this,&RenderMenubar::s_CallVoteButton,pcVar6,
                                  this->m_ActivePage == 4,&Button,fVar10,fVar10,0xf,5.0,0.0);
      if ((bVar3) || (bVar3 = CheckHotKey(this,0x76), bVar3)) {
        NewPage = 4;
      }
      CUIRect::VSplitRight(&Right,fVar9,&Right,&Button);
      if ((RenderMenubar(CUIRect)::s_SettingsButton == '\0') &&
         (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_SettingsButton), iVar5 != 0)) {
        RenderMenubar::s_SettingsButton.m_FadeStartTime = 0.0;
        RenderMenubar::s_SettingsButton.m_CleanBackground = false;
        __cxa_guard_release(&RenderMenubar(CUIRect)::s_SettingsButton);
      }
      pcVar6 = Localize("Settings","");
      bVar3 = DoButton_MenuTabTop(this,&RenderMenubar::s_SettingsButton,pcVar6,this->m_GamePage == 8
                                  ,&Button,1.0,1.0,0xf,5.0,0.0);
      if ((bVar3) || (bVar3 = CheckHotKey(this,0x73), bVar3)) {
        NewPage = 8;
      }
      CUIRect::VSplitRight(&Right,3.0,&Right,(CUIRect *)0x0);
      CUIRect::VSplitRight(&Right,fVar9 * 0.5,&Right,&Button);
      if ((RenderMenubar(CUIRect)::s_ServerBrowserButton == '\0') &&
         (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_ServerBrowserButton), iVar5 != 0))
      {
        RenderMenubar::s_ServerBrowserButton.m_FadeStartTime = 0.0;
        RenderMenubar::s_ServerBrowserButton.m_CleanBackground = false;
        __cxa_guard_release(&RenderMenubar(CUIRect)::s_ServerBrowserButton);
      }
      bVar3 = CUI::MouseHovered(&((this->super_CComponent).m_pClient)->m_UI,&Button);
      bVar8 = this->m_GamePage - 5U < 2;
      bVar3 = DoButton_SpriteID(this,&RenderMenubar::s_ServerBrowserButton,8,(bVar3 || bVar8) + 0xb5
                                ,bVar8,&Button,0xf,5.0,true);
      if ((bVar3) || (bVar3 = CheckHotKey(this,0x62), bVar3)) {
        iVar5 = (*(((this->super_CComponent).m_pClient)->m_pServerBrowser->super_IInterface).
                  _vptr_IInterface[2])();
        NewPage = 6 - (uint)(iVar5 == 0);
      }
      CUIRect::HSplitTop(&Rect_local,3.0,(CUIRect *)0x0,&Rect_local);
      CUIRect::HSplitTop(&Rect_local,25.0,&Box,&Rect_local);
      iVar4 = ((this->super_CComponent).m_pClient)->m_pClient->m_State;
      iVar5 = this->m_MenuPage;
      goto LAB_00143f88;
    }
    NewPage = -1;
    bVar3 = false;
LAB_00143f9d:
    bVar8 = true;
    if (this->m_GamePage != 8 || iVar4 != 3) {
      if (bVar3) {
        if (1 < iVar5 - 5U) {
          if (iVar5 == 7) {
            RenderBackgroundShadow(this,&Box,false,5.0);
            CUIRect::HSplitBottom(&Box,25.0,(CUIRect *)0x0,&Box);
            Left.x = 1.0;
            Left.y = 1.0;
            Left.w = 1.0;
            Left.h = 0.75;
            CUIRect::Draw(&Box,(vec4 *)&Left,5.0,0xf);
            pCVar7 = (this->super_CComponent).m_pClient;
            pcVar6 = Localize("Demos","");
            CUI::DoLabelSelected(&pCVar7->m_UI,&Box,pcVar6,true,Box.h * 0.8,5);
          }
          goto LAB_0014446f;
        }
      }
      else if (1 < this->m_GamePage - 5U || iVar4 != 3) goto LAB_0014446f;
      fVar10 = Box.w / 6.0 + -2.5;
      if (iVar4 == 3) {
        Corners = 3;
      }
      CUIRect::VSplitLeft(&Box,fVar10 + fVar10 + 3.0,&Left,(CUIRect *)0x0);
      if (((this->super_CComponent).m_pClient)->m_pClient->m_State == 0) {
        RenderBackgroundShadow(this,&Left,false,5.0);
      }
      CUIRect::HSplitBottom(&Left,25.0,(CUIRect *)0x0,&Left);
      CUIRect::VSplitLeft(&Left,fVar10,&Button,&Left);
      if ((RenderMenubar(CUIRect)::s_InternetButton == '\0') &&
         (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_InternetButton), iVar5 != 0)) {
        RenderMenubar::s_InternetButton.m_FadeStartTime = 0.0;
        RenderMenubar::s_InternetButton.m_CleanBackground = false;
        __cxa_guard_release(&RenderMenubar(CUIRect)::s_InternetButton);
      }
      fVar9 = *(float *)(&DAT_001c8b4c + (ulong)(iVar4 == 3) * 4);
      pcVar6 = Localize("Global","");
      if (this->m_ActivePage == 5) {
        bVar3 = ((this->super_CComponent).m_pClient)->m_pClient->m_State == 0;
        fVar11 = 1.0;
      }
      else {
        bVar3 = false;
        fVar11 = fVar9;
      }
      bVar3 = DoButton_MenuTabTop(this,&RenderMenubar::s_InternetButton,pcVar6,bVar3,&Button,fVar11,
                                  1.0,Corners,5.0,0.0);
      if ((bVar3) || (bVar3 = CheckHotKey(this,0x67), bVar3)) {
        CCamera::ChangePosition(((this->super_CComponent).m_pClient)->m_pCamera,1);
        (*(((this->super_CComponent).m_pClient)->m_pServerBrowser->super_IInterface).
          _vptr_IInterface[3])();
        ((this->super_CComponent).m_pClient)->m_pConfig->m_UiBrowserPage = 5;
        NewPage = 5;
      }
      CUIRect::VSplitLeft(&Left,3.0,(CUIRect *)0x0,&Left);
      CUIRect::VSplitLeft(&Left,fVar10,&Button,&Left);
      if ((RenderMenubar(CUIRect)::s_LanButton == '\0') &&
         (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_LanButton), iVar5 != 0)) {
        RenderMenubar::s_LanButton.m_FadeStartTime = 0.0;
        RenderMenubar::s_LanButton.m_CleanBackground = false;
        __cxa_guard_release(&RenderMenubar(CUIRect)::s_LanButton);
      }
      pcVar6 = Localize("Local","");
      if (this->m_ActivePage == 6) {
        bVar3 = ((this->super_CComponent).m_pClient)->m_pClient->m_State == 0;
        fVar9 = 1.0;
      }
      else {
        bVar3 = false;
      }
      bVar3 = DoButton_MenuTabTop(this,&RenderMenubar::s_LanButton,pcVar6,bVar3,&Button,fVar9,1.0,
                                  Corners,5.0,0.0);
      if ((bVar3) || (bVar3 = CheckHotKey(this,0x6c), bVar3)) {
        CCamera::ChangePosition(((this->super_CComponent).m_pClient)->m_pCamera,2);
        pIVar2 = ((this->super_CComponent).m_pClient)->m_pServerBrowser;
        (*(pIVar2->super_IInterface)._vptr_IInterface[3])(pIVar2,1);
        pCVar7 = (this->super_CComponent).m_pClient;
        pCVar7->m_pConfig->m_UiBrowserPage = 6;
        NewPage = 6;
      }
      else {
        pCVar7 = (this->super_CComponent).m_pClient;
      }
      if (pCVar7->m_pClient->m_State == 0) {
        CUIRect::VSplitRight(&Box,20.0,&Box,(CUIRect *)0x0);
        CUIRect::VSplitRight(&Box,60.0,(CUIRect *)0x0,&Right);
        CUIRect::HSplitBottom(&Right,20.0,(CUIRect *)0x0,&Button_1);
      }
      goto LAB_0014446f;
    }
  }
  if (bVar8) {
    fVar10 = 0.5;
  }
  else {
    fVar10 = 1.0;
  }
  fVar9 = Box.w / 5.0 + -2.4;
  if (bVar8) {
    Corners = 3;
  }
  if (bVar3) {
    RenderBackgroundShadow(this,&Box,false,5.0);
  }
  CUIRect::HSplitBottom(&Box,25.0,(CUIRect *)0x0,&Box);
  CUIRect::VSplitLeft(&Box,fVar9,&Button,&Box);
  if ((RenderMenubar(CUIRect)::s_GeneralButton == '\0') &&
     (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_GeneralButton), iVar5 != 0)) {
    RenderMenubar::s_GeneralButton.m_FadeStartTime = 0.0;
    RenderMenubar::s_GeneralButton.m_CleanBackground = false;
    __cxa_guard_release(&RenderMenubar(CUIRect)::s_GeneralButton);
  }
  pcVar6 = Localize("General","");
  pCVar7 = (this->super_CComponent).m_pClient;
  iVar5 = pCVar7->m_pConfig->m_UiSettingsPage;
  fVar11 = 1.0;
  if (iVar5 != 0) {
    fVar11 = fVar10;
  }
  bVar3 = DoButton_MenuTabTop(this,&RenderMenubar::s_GeneralButton,pcVar6,
                              pCVar7->m_pClient->m_State == 0 && iVar5 == 0,&Button,fVar11,1.0,
                              Corners,5.0,0.0);
  if (bVar3) {
    CCamera::ChangePosition(((this->super_CComponent).m_pClient)->m_pCamera,4);
    ((this->super_CComponent).m_pClient)->m_pConfig->m_UiSettingsPage = 0;
  }
  CUIRect::VSplitLeft(&Box,3.0,(CUIRect *)0x0,&Box);
  CUIRect::VSplitLeft(&Box,fVar9,&Button,&Box);
  if ((RenderMenubar(CUIRect)::s_PlayerButton == '\0') &&
     (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_PlayerButton), iVar5 != 0)) {
    RenderMenubar::s_PlayerButton.m_FadeStartTime = 0.0;
    RenderMenubar::s_PlayerButton.m_CleanBackground = false;
    __cxa_guard_release(&RenderMenubar(CUIRect)::s_PlayerButton);
  }
  pcVar6 = Localize("Player","");
  pCVar7 = (this->super_CComponent).m_pClient;
  bVar3 = pCVar7->m_pConfig->m_UiSettingsPage == 1;
  fVar11 = 1.0;
  if (!bVar3) {
    fVar11 = fVar10;
  }
  bVar3 = DoButton_MenuTabTop(this,&RenderMenubar::s_PlayerButton,pcVar6,
                              pCVar7->m_pClient->m_State == 0 && bVar3,&Button,fVar11,1.0,Corners,
                              5.0,0.0);
  if (bVar3) {
    CCamera::ChangePosition(((this->super_CComponent).m_pClient)->m_pCamera,5);
    ((this->super_CComponent).m_pClient)->m_pConfig->m_UiSettingsPage = 1;
  }
  CUIRect::VSplitLeft(&Box,3.0,(CUIRect *)0x0,&Box);
  CUIRect::VSplitLeft(&Box,fVar9,&Button,&Box);
  if ((RenderMenubar(CUIRect)::s_ControlsButton == '\0') &&
     (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_ControlsButton), iVar5 != 0)) {
    RenderMenubar::s_ControlsButton.m_FadeStartTime = 0.0;
    RenderMenubar::s_ControlsButton.m_CleanBackground = false;
    __cxa_guard_release(&RenderMenubar(CUIRect)::s_ControlsButton);
  }
  pcVar6 = Localize("Controls","");
  pCVar7 = (this->super_CComponent).m_pClient;
  bVar3 = pCVar7->m_pConfig->m_UiSettingsPage == 3;
  fVar11 = 1.0;
  if (!bVar3) {
    fVar11 = fVar10;
  }
  bVar3 = DoButton_MenuTabTop(this,&RenderMenubar::s_ControlsButton,pcVar6,
                              pCVar7->m_pClient->m_State == 0 && bVar3,&Button,fVar11,1.0,Corners,
                              5.0,0.0);
  if (bVar3) {
    CCamera::ChangePosition(((this->super_CComponent).m_pClient)->m_pCamera,7);
    ((this->super_CComponent).m_pClient)->m_pConfig->m_UiSettingsPage = 3;
  }
  CUIRect::VSplitLeft(&Box,3.0,(CUIRect *)0x0,&Box);
  CUIRect::VSplitLeft(&Box,fVar9,&Button,&Box);
  if ((RenderMenubar(CUIRect)::s_GraphicsButton == '\0') &&
     (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_GraphicsButton), iVar5 != 0)) {
    RenderMenubar::s_GraphicsButton.m_FadeStartTime = 0.0;
    RenderMenubar::s_GraphicsButton.m_CleanBackground = false;
    __cxa_guard_release(&RenderMenubar(CUIRect)::s_GraphicsButton);
  }
  pcVar6 = Localize("Graphics","");
  pCVar7 = (this->super_CComponent).m_pClient;
  bVar3 = pCVar7->m_pConfig->m_UiSettingsPage == 4;
  fVar11 = 1.0;
  if (!bVar3) {
    fVar11 = fVar10;
  }
  bVar3 = DoButton_MenuTabTop(this,&RenderMenubar::s_GraphicsButton,pcVar6,
                              pCVar7->m_pClient->m_State == 0 && bVar3,&Button,fVar11,1.0,Corners,
                              5.0,0.0);
  if (bVar3) {
    CCamera::ChangePosition(((this->super_CComponent).m_pClient)->m_pCamera,8);
    ((this->super_CComponent).m_pClient)->m_pConfig->m_UiSettingsPage = 4;
  }
  CUIRect::VSplitLeft(&Box,3.0,(CUIRect *)0x0,&Box);
  CUIRect::VSplitLeft(&Box,fVar9,&Button,&Box);
  if ((RenderMenubar(CUIRect)::s_SoundButton == '\0') &&
     (iVar5 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_SoundButton), iVar5 != 0)) {
    RenderMenubar::s_SoundButton.m_FadeStartTime = 0.0;
    RenderMenubar::s_SoundButton.m_CleanBackground = false;
    __cxa_guard_release(&RenderMenubar(CUIRect)::s_SoundButton);
  }
  pcVar6 = Localize("Sound","");
  pCVar7 = (this->super_CComponent).m_pClient;
  bVar3 = pCVar7->m_pConfig->m_UiSettingsPage == 5;
  fVar9 = 1.0;
  if (!bVar3) {
    fVar9 = fVar10;
  }
  bVar3 = DoButton_MenuTabTop(this,&RenderMenubar::s_SoundButton,pcVar6,
                              pCVar7->m_pClient->m_State == 0 && bVar3,&Button,fVar9,1.0,Corners,5.0
                              ,0.0);
  if (bVar3) {
    CCamera::ChangePosition(((this->super_CComponent).m_pClient)->m_pCamera,9);
    ((this->super_CComponent).m_pClient)->m_pConfig->m_UiSettingsPage = 5;
  }
LAB_0014446f:
  if ((NewPage != -1) &&
     ((((this->super_CComponent).m_pClient)->m_pClient->m_State == 0 ||
      (this->m_GamePage = NewPage, NewPage - 5U < 2)))) {
    SetMenuPage(this,NewPage);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMenus::RenderMenubar(CUIRect Rect)
{
	CUIRect Box;
	CUIRect Button;
	Rect.HSplitTop(60.0f, &Box, &Rect);
	const float InactiveAlpha = 0.25f;

	m_ActivePage = m_MenuPage;
	int NewPage = -1;

	if(Client()->State() != IClient::STATE_OFFLINE)
		m_ActivePage = m_GamePage;

	if(Client()->State() == IClient::STATE_ONLINE)
	{
		int NumButtons = 6;
		float Spacing = 3.0f;
		float ButtonWidth = (Box.w/NumButtons)-(Spacing*(NumButtons-1))/NumButtons;
		float Alpha = 1.0f;
		if(m_GamePage == PAGE_SETTINGS)
			Alpha = InactiveAlpha;

		// render header backgrounds
		CUIRect Left, Right;
		Box.VSplitLeft(ButtonWidth*4.0f + Spacing*3.0f, &Left, 0);
		Box.VSplitRight(ButtonWidth*1.5f + Spacing, 0, &Right);
		RenderBackgroundShadow(&Left, false);
		RenderBackgroundShadow(&Right, false);

		Left.HSplitBottom(25.0f, 0, &Left);
		Right.HSplitBottom(25.0f, 0, &Right);

		Left.VSplitLeft(ButtonWidth, &Button, &Left);
		static CButtonContainer s_GameButton;
		if(DoButton_MenuTabTop(&s_GameButton, Localize("Game"), m_ActivePage == PAGE_GAME, &Button, Alpha, Alpha) || CheckHotKey(KEY_G))
			NewPage = PAGE_GAME;

		Left.VSplitLeft(Spacing, 0, &Left); // little space
		Left.VSplitLeft(ButtonWidth, &Button, &Left);
		static CButtonContainer s_PlayersButton;
		if(DoButton_MenuTabTop(&s_PlayersButton, Localize("Players"), m_ActivePage == PAGE_PLAYERS, &Button, Alpha, Alpha) || CheckHotKey(KEY_P))
			NewPage = PAGE_PLAYERS;

		Left.VSplitLeft(Spacing, 0, &Left); // little space
		Left.VSplitLeft(ButtonWidth, &Button, &Left);
		static CButtonContainer s_ServerInfoButton;
		if(DoButton_MenuTabTop(&s_ServerInfoButton, Localize("Server info"), m_ActivePage == PAGE_SERVER_INFO, &Button, Alpha, Alpha) || CheckHotKey(KEY_I))
			NewPage = PAGE_SERVER_INFO;

		Left.VSplitLeft(Spacing, 0, &Left); // little space
		Left.VSplitLeft(ButtonWidth, &Button, &Left);
		static CButtonContainer s_CallVoteButton;
		if(DoButton_MenuTabTop(&s_CallVoteButton, Localize("Call vote"), m_ActivePage == PAGE_CALLVOTE, &Button, Alpha, Alpha) || CheckHotKey(KEY_V))
			NewPage = PAGE_CALLVOTE;

		Right.VSplitRight(ButtonWidth, &Right, &Button);
		static CButtonContainer s_SettingsButton;
		if(DoButton_MenuTabTop(&s_SettingsButton, Localize("Settings"), m_GamePage == PAGE_SETTINGS, &Button) || CheckHotKey(KEY_S))
			NewPage = PAGE_SETTINGS;

		Right.VSplitRight(Spacing, &Right, 0); // little space
		Right.VSplitRight(ButtonWidth/2.0f, &Right, &Button);
		static CButtonContainer s_ServerBrowserButton;
		if(DoButton_SpriteID(&s_ServerBrowserButton, IMAGE_BROWSER, UI()->MouseHovered(&Button) || m_GamePage == PAGE_INTERNET || m_GamePage == PAGE_LAN ? SPRITE_BROWSER_B : SPRITE_BROWSER_A,
			m_GamePage == PAGE_INTERNET || m_GamePage == PAGE_LAN, &Button) || CheckHotKey(KEY_B))
		{
			NewPage = ServerBrowser()->GetType() == IServerBrowser::TYPE_INTERNET ? PAGE_INTERNET : PAGE_LAN;
		}

		Rect.HSplitTop(Spacing, 0, &Rect);
		Rect.HSplitTop(25.0f, &Box, &Rect);
	}

	if((Client()->State() == IClient::STATE_OFFLINE && m_MenuPage == PAGE_SETTINGS) || (Client()->State() == IClient::STATE_ONLINE && m_GamePage == PAGE_SETTINGS))
	{
		int NumButtons = 5;
		float Spacing = 3.0f;
		float ButtonWidth = (Box.w/NumButtons)-(Spacing*(NumButtons-1))/NumButtons;
		float NotActiveAlpha = Client()->State() == IClient::STATE_ONLINE ? 0.5f : 1.0f;
		int Corners = Client()->State() == IClient::STATE_ONLINE ? CUIRect::CORNER_T : CUIRect::CORNER_ALL;

		// render header background
		if(Client()->State() == IClient::STATE_OFFLINE)
			RenderBackgroundShadow(&Box, false);

		Box.HSplitBottom(25.0f, 0, &Box);

		Box.VSplitLeft(ButtonWidth, &Button, &Box);
		static CButtonContainer s_GeneralButton;
		if(DoButton_MenuTabTop(&s_GeneralButton, Localize("General"), Client()->State() == IClient::STATE_OFFLINE && Config()->m_UiSettingsPage==SETTINGS_GENERAL, &Button,
			Config()->m_UiSettingsPage == SETTINGS_GENERAL ? 1.0f : NotActiveAlpha, 1.0f, Corners))
		{
			m_pClient->m_pCamera->ChangePosition(CCamera::POS_SETTINGS_GENERAL);
			Config()->m_UiSettingsPage = SETTINGS_GENERAL;
		}

		Box.VSplitLeft(Spacing, 0, &Box); // little space
		Box.VSplitLeft(ButtonWidth, &Button, &Box);
		{
			static CButtonContainer s_PlayerButton;
			if(DoButton_MenuTabTop(&s_PlayerButton, Localize("Player"), Client()->State() == IClient::STATE_OFFLINE && Config()->m_UiSettingsPage == SETTINGS_PLAYER, &Button,
				Config()->m_UiSettingsPage == SETTINGS_PLAYER ? 1.0f : NotActiveAlpha, 1.0f, Corners))
			{
				m_pClient->m_pCamera->ChangePosition(CCamera::POS_SETTINGS_PLAYER);
				Config()->m_UiSettingsPage = SETTINGS_PLAYER;
			}
		}


		// TODO: replace tee page to something else
		// Box.VSplitLeft(Spacing, 0, &Box); // little space
		// Box.VSplitLeft(ButtonWidth, &Button, &Box);
		// {
		// 	static CButtonContainer s_TeeButton;
		// 	if(DoButton_MenuTabTop(&s_TeeButton, Localize("TBD"), Client()->State() == IClient::STATE_OFFLINE && Config()->m_UiSettingsPage == SETTINGS_TBD, &Button,
		// 		Config()->m_UiSettingsPage == SETTINGS_TBD ? 1.0f : NotActiveAlpha, 1.0f, Corners))
		// 	{
		// 		m_pClient->m_pCamera->ChangePosition(CCamera::POS_SETTINGS_TBD);
		// 		Config()->m_UiSettingsPage = SETTINGS_TBD;
		// 	}
		// }

		Box.VSplitLeft(Spacing, 0, &Box); // little space
		Box.VSplitLeft(ButtonWidth, &Button, &Box);
		static CButtonContainer s_ControlsButton;
		if(DoButton_MenuTabTop(&s_ControlsButton, Localize("Controls"), Client()->State() == IClient::STATE_OFFLINE && Config()->m_UiSettingsPage==SETTINGS_CONTROLS, &Button,
			Config()->m_UiSettingsPage == SETTINGS_CONTROLS ? 1.0f : NotActiveAlpha, 1.0f, Corners))
		{
			m_pClient->m_pCamera->ChangePosition(CCamera::POS_SETTINGS_CONTROLS);
			Config()->m_UiSettingsPage = SETTINGS_CONTROLS;
		}

		Box.VSplitLeft(Spacing, 0, &Box); // little space
		Box.VSplitLeft(ButtonWidth, &Button, &Box);
		static CButtonContainer s_GraphicsButton;
		if(DoButton_MenuTabTop(&s_GraphicsButton, Localize("Graphics"), Client()->State() == IClient::STATE_OFFLINE && Config()->m_UiSettingsPage==SETTINGS_GRAPHICS, &Button,
			Config()->m_UiSettingsPage == SETTINGS_GRAPHICS ? 1.0f : NotActiveAlpha, 1.0f, Corners))
		{
			m_pClient->m_pCamera->ChangePosition(CCamera::POS_SETTINGS_GRAPHICS);
			Config()->m_UiSettingsPage = SETTINGS_GRAPHICS;
		}

		Box.VSplitLeft(Spacing, 0, &Box); // little space
		Box.VSplitLeft(ButtonWidth, &Button, &Box);
		static CButtonContainer s_SoundButton;
		if(DoButton_MenuTabTop(&s_SoundButton, Localize("Sound"), Client()->State() == IClient::STATE_OFFLINE && Config()->m_UiSettingsPage==SETTINGS_SOUND, &Button,
			Config()->m_UiSettingsPage == SETTINGS_SOUND ? 1.0f : NotActiveAlpha, 1.0f, Corners))
		{
			m_pClient->m_pCamera->ChangePosition(CCamera::POS_SETTINGS_SOUND);
			Config()->m_UiSettingsPage = SETTINGS_SOUND;
		}
	}
	else if((Client()->State() == IClient::STATE_OFFLINE && m_MenuPage >= PAGE_INTERNET && m_MenuPage <= PAGE_LAN) || (Client()->State() == IClient::STATE_ONLINE && m_GamePage >= PAGE_INTERNET && m_GamePage <= PAGE_LAN))
	{
		float Spacing = 3.0f;
		float ButtonWidth = (Box.w/6.0f)-(Spacing*5.0)/6.0f;
		int Corners = Client()->State() == IClient::STATE_ONLINE ? CUIRect::CORNER_T : CUIRect::CORNER_ALL;
		float NotActiveAlpha = Client()->State() == IClient::STATE_ONLINE ? 0.5f : 1.0f;

		CUIRect Left;
		Box.VSplitLeft(ButtonWidth*2.0f+Spacing, &Left, 0);

		// render header backgrounds
		if(Client()->State() == IClient::STATE_OFFLINE)
			RenderBackgroundShadow(&Left, false);

		Left.HSplitBottom(25.0f, 0, &Left);

		Left.VSplitLeft(ButtonWidth, &Button, &Left);
		static CButtonContainer s_InternetButton;
		if(DoButton_MenuTabTop(&s_InternetButton, Localize("Global"), m_ActivePage==PAGE_INTERNET && Client()->State() == IClient::STATE_OFFLINE, &Button,
			m_ActivePage==PAGE_INTERNET ? 1.0f : NotActiveAlpha, 1.0f, Corners) || CheckHotKey(KEY_G))
		{
			m_pClient->m_pCamera->ChangePosition(CCamera::POS_INTERNET);
			ServerBrowser()->SetType(IServerBrowser::TYPE_INTERNET);
			NewPage = PAGE_INTERNET;
			Config()->m_UiBrowserPage = PAGE_INTERNET;
		}

		Left.VSplitLeft(Spacing, 0, &Left); // little space
		Left.VSplitLeft(ButtonWidth, &Button, &Left);
		static CButtonContainer s_LanButton;
		if(DoButton_MenuTabTop(&s_LanButton, Localize("Local"), m_ActivePage==PAGE_LAN && Client()->State() == IClient::STATE_OFFLINE, &Button,
			m_ActivePage==PAGE_LAN ? 1.0f : NotActiveAlpha, 1.0f, Corners) || CheckHotKey(KEY_L))
		{
			m_pClient->m_pCamera->ChangePosition(CCamera::POS_LAN);
			ServerBrowser()->SetType(IServerBrowser::TYPE_LAN);
			NewPage = PAGE_LAN;
			Config()->m_UiBrowserPage = PAGE_LAN;
		}

		if(Client()->State() == IClient::STATE_OFFLINE)
		{
			CUIRect Right, Button;
			Box.VSplitRight(20.0f, &Box, 0);
			Box.VSplitRight(60.0f, 0, &Right);
			Right.HSplitBottom(20.0f, 0, &Button);
		}
	}
	else if(Client()->State() == IClient::STATE_OFFLINE)
	{
		if(m_MenuPage == PAGE_DEMOS)
		{
			// render header background
			RenderBackgroundShadow(&Box, false);

			Box.HSplitBottom(25.0f, 0, &Box);

			// make the header look like an active tab
			Box.Draw(vec4(1.0f, 1.0f, 1.0f, 0.75f));
			UI()->DoLabelSelected(&Box, Localize("Demos"), true, Box.h*CUI::ms_FontmodHeight, TEXTALIGN_MC);
		}
	}



	if(NewPage != -1)
	{
		if(Client()->State() == IClient::STATE_OFFLINE)
			SetMenuPage(NewPage);
		else
		{
			m_GamePage = NewPage;
			if(NewPage == PAGE_INTERNET || NewPage == PAGE_LAN)
				SetMenuPage(NewPage);
		}
	}
}